

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O3

JavascriptString * Js::JavascriptConversion::ToLocaleString(Var aValue,ScriptContext *scriptContext)

{
  ImplicitCallFlags IVar1;
  Type TVar2;
  ThreadContext *this;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  Attributes attributes;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  Var aValue_00;
  JavascriptMethod p_Var9;
  JavascriptTypedNumber<long> *pJVar10;
  JavascriptTypedNumber<unsigned_long> *pJVar11;
  JavascriptSymbol *this_00;
  JavascriptBoolean *pJVar12;
  JavascriptString *pJVar13;
  PropertyRecord *pPVar14;
  char *message;
  char *error;
  uint lineNumber;
  Type *this_01;
  double value;
  undefined1 auVar15 [16];
  
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00a8c082;
    *puVar7 = 0;
LAB_00a8baec:
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00a8c082;
      *puVar7 = 0;
    }
    TVar2 = ((pRVar8->type).ptr)->typeId;
    if ((0x57 < (int)TVar2) && (BVar6 = RecyclableObject::IsExternal(pRVar8), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00a8c082;
      *puVar7 = 0;
    }
    switch(TVar2) {
    case TypeIds_Undefined:
      pJVar13 = StringCache::GetUndefinedDisplay
                          (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                            stringCache);
      return pJVar13;
    case TypeIds_Null:
      pJVar13 = StringCache::GetNullDisplay
                          (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                            stringCache);
      return pJVar13;
    case TypeIds_Boolean:
      pJVar12 = UnsafeVarTo<Js::JavascriptBoolean>(aValue);
      this_01 = &((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache;
      if (pJVar12->value != 0) {
        pJVar13 = StringCache::GetTrueDisplay(this_01);
        return pJVar13;
      }
      pJVar13 = StringCache::GetFalseDisplay(this_01);
      return pJVar13;
    case TypeIds_FirstNumberType:
      bVar4 = ((ulong)aValue & 0xffff000000000000) == 0x1000000000000;
      goto LAB_00a8be40;
    case TypeIds_Number:
switchD_00a8bbdb_caseD_4:
      if ((ulong)aValue >> 0x32 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                    ,0xd4,"(Is(aValue))",
                                    "Ensure var is actually a \'JavascriptNumber\'");
        if (!bVar4) goto LAB_00a8c082;
        *puVar7 = 0;
      }
      value = (double)((ulong)aValue ^ 0xfffc000000000000);
      break;
    case TypeIds_Int64Number:
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
      value = (double)pJVar10->m_value;
      break;
    case TypeIds_LastNumberType:
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
      auVar15._0_8_ = (double)CONCAT44(0x43300000,(int)pJVar11->m_value);
      auVar15._8_4_ = (int)(pJVar11->m_value >> 0x20);
      auVar15._12_4_ = 0x45300000;
      value = (auVar15._0_8_ - 4503599627370496.0) + (auVar15._8_8_ - 1.9342813113834067e+25);
      break;
    default:
      pRVar8 = VarTo<Js::RecyclableObject>(aValue);
      aValue_00 = JavascriptOperators::GetProperty
                            (pRVar8,0x172,scriptContext,(PropertyValueInfo *)0x0);
      bVar4 = IsCallable(aValue_00);
      if (!bVar4) {
        pPVar14 = ScriptContext::GetPropertyName(scriptContext,0x172);
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec45,(PCWSTR)(pPVar14 + 1));
      }
      pRVar8 = VarTo<Js::RecyclableObject>(aValue_00);
      this = scriptContext->threadContext;
      bVar4 = this->reentrancySafeOrHandled;
      this->reentrancySafeOrHandled = true;
      attributes = FunctionInfo::GetAttributes(pRVar8);
      bVar5 = ThreadContext::HasNoSideEffect(this,pRVar8,attributes);
      if (bVar5) {
        ThreadContext::CheckAndResetReentrancySafeOrHandled(scriptContext->threadContext);
        if (scriptContext->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
        CheckIsExecutable(pRVar8,p_Var9);
        p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
        pRVar8 = (RecyclableObject *)(*p_Var9)(pRVar8,(CallInfo)pRVar8,1,0,0,0,0,1,aValue);
        bVar5 = ThreadContext::IsOnStack(pRVar8);
      }
      else {
        if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
          this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_ToPrimitive;
          pRVar8 = (((((((((pRVar8->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase
                       ).scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).undefinedValue.ptr;
          goto LAB_00a8bfd1;
        }
        if ((attributes & HasNoSideEffect) == None) {
          IVar1 = this->implicitCallFlags;
          ThreadContext::CheckAndResetReentrancySafeOrHandled(scriptContext->threadContext);
          if (scriptContext->threadContext->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
          CheckIsExecutable(pRVar8,p_Var9);
          p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
          pRVar8 = (RecyclableObject *)(*p_Var9)(pRVar8,(CallInfo)pRVar8,1,0,0,0,0,1,aValue);
          this->implicitCallFlags = IVar1 | ImplicitCall_ToPrimitive;
          goto LAB_00a8bfd1;
        }
        ThreadContext::CheckAndResetReentrancySafeOrHandled(scriptContext->threadContext);
        if (scriptContext->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
        CheckIsExecutable(pRVar8,p_Var9);
        p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
        pRVar8 = (RecyclableObject *)(*p_Var9)(pRVar8,(CallInfo)pRVar8,1,0,0,0,0,1,aValue);
        bVar5 = ThreadContext::IsOnStack(pRVar8);
      }
      if (bVar5 != false) {
        this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_ToPrimitive;
      }
LAB_00a8bfd1:
      this->reentrancySafeOrHandled = bVar4;
      bVar4 = VarIs<Js::JavascriptString>(pRVar8);
      if (bVar4) {
        pJVar13 = UnsafeVarTo<Js::JavascriptString>(pRVar8);
        return pJVar13;
      }
      pJVar13 = ToString(pRVar8,scriptContext);
      return pJVar13;
    case TypeIds_Symbol:
      this_00 = UnsafeVarTo<Js::JavascriptSymbol>(aValue);
      pJVar13 = JavascriptSymbol::ToString(this_00,scriptContext);
      return pJVar13;
    }
    goto LAB_00a8bef3;
  }
  if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
    bVar4 = true;
    if (((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)aValue >> 0x32 == 0) goto LAB_00a8baec;
      goto switchD_00a8bbdb_caseD_4;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00a8c082;
    *puVar7 = 0;
    bVar4 = true;
  }
LAB_00a8be40:
  if ((bool)(bVar4 ^ 1U | ((ulong)aValue & 0x1ffff00000000) == 0x1000000000000)) {
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      error = "(Is(aValue))";
      message = "Ensure var is actually a \'TaggedInt\'";
      lineNumber = 0x43;
      goto LAB_00a8bed7;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
LAB_00a8bed7:
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,lineNumber,error,message);
    if (!bVar4) {
LAB_00a8c082:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  value = (double)(int)aValue;
LAB_00a8bef3:
  pJVar13 = JavascriptNumber::ToLocaleString(value,scriptContext);
  return pJVar13;
}

Assistant:

JavascriptString *JavascriptConversion::ToLocaleString(Var aValue, ScriptContext* scriptContext)
    {
        switch (JavascriptOperators::GetTypeId(aValue))
        {
        case TypeIds_Undefined:
            return scriptContext->GetLibrary()->GetUndefinedDisplayString();

        case TypeIds_Null:
            return scriptContext->GetLibrary()->GetNullDisplayString();

        case TypeIds_Integer:
            return JavascriptNumber::ToLocaleString(TaggedInt::ToInt32(aValue), scriptContext);

        case TypeIds_Boolean:
            return UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? scriptContext->GetLibrary()->GetTrueDisplayString() : scriptContext->GetLibrary()->GetFalseDisplayString();

        case TypeIds_Int64Number:
            return JavascriptNumber::ToLocaleString((double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue(), scriptContext);

        case TypeIds_UInt64Number:
            return JavascriptNumber::ToLocaleString((double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue(), scriptContext);

        case TypeIds_Number:
            return JavascriptNumber::ToLocaleString(JavascriptNumber::GetValue(aValue), scriptContext);

        case TypeIds_Symbol:
            return UnsafeVarTo<JavascriptSymbol>(aValue)->ToString(scriptContext);

        default:
            {
                RecyclableObject* object = VarTo<RecyclableObject>(aValue);
                Var value = JavascriptOperators::GetProperty(object, PropertyIds::toLocaleString, scriptContext, NULL);

                if (JavascriptConversion::IsCallable(value))
                {
                    RecyclableObject* toLocaleStringFunction = VarTo<RecyclableObject>(value);
                    Var aResult = scriptContext->GetThreadContext()->ExecuteImplicitCall(toLocaleStringFunction, Js::ImplicitCall_ToPrimitive, [=]()->Js::Var
                    {
                        return CALL_FUNCTION(scriptContext->GetThreadContext(), toLocaleStringFunction, CallInfo(1), aValue);
                    });
                    if (VarIs<JavascriptString>(aResult))
                    {
                        return UnsafeVarTo<JavascriptString>(aResult);
                    }
                    else
                    {
                        return JavascriptConversion::ToString(aResult, scriptContext);
                    }
                }

                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::toLocaleString)->GetBuffer());
            }
        }
    }